

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_concat(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  long lVar22;
  size_t __n;
  char *pcVar23;
  undefined1 *puVar24;
  undefined2 *puVar25;
  undefined4 *puVar26;
  int i0_3;
  long lVar27;
  void *__src;
  undefined8 uVar28;
  int i1;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int i2;
  long lVar34;
  int i0;
  long lVar35;
  ulong uVar36;
  int i1_3;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  long local_180;
  long local_178;
  long local_98 [5];
  long local_70;
  long local_68;
  long local_60;
  size_t local_58;
  long local_50;
  size_t local_48;
  size_t local_40;
  ulong local_38;
  
  pgVar2 = dst->src[0];
  gVar1 = pgVar2->type;
  switch(gVar1) {
  case GGML_TYPE_I8:
    pgVar3 = dst->src[1];
    lVar22 = ggml_type_size(0x18);
    if (lVar22 == 1) {
      uVar42 = (ulong)(uint)dst->op_params[0];
      if (uVar42 < 4) {
        lVar35 = (long)params->ith;
        sVar4 = pgVar2->nb[3];
        sVar5 = pgVar2->nb[1];
        lVar22 = pgVar2->ne[2];
        sVar6 = pgVar3->nb[1];
        lVar7 = pgVar2->ne[3];
        lVar8 = pgVar2->ne[0];
        lVar9 = pgVar2->ne[1];
        sVar10 = pgVar2->nb[2];
        sVar11 = pgVar3->nb[0];
        sVar12 = pgVar3->nb[2];
        sVar13 = pgVar3->nb[3];
        sVar14 = dst->nb[3];
        sVar15 = pgVar2->nb[0];
        lVar29 = (long)params->nth;
        lVar16 = dst->ne[2];
        uVar17 = dst->ne[3];
        uVar18 = dst->ne[0];
        sVar19 = dst->nb[1];
        sVar20 = dst->nb[0];
        sVar21 = dst->nb[2];
        uVar41 = dst->ne[1];
        local_98[0] = 0;
        local_98[1] = 0;
        local_98[2] = 0;
        local_98[3] = 0;
        local_98[uVar42] = pgVar2->ne[uVar42];
        lVar37 = sVar21 * lVar35;
        lVar27 = sVar10 * lVar35;
        for (uVar42 = 0; uVar42 != (~((long)uVar17 >> 0x3f) & uVar17); uVar42 = uVar42 + 1) {
          lVar33 = lVar27;
          lVar40 = lVar37;
          for (lVar34 = lVar35; lVar34 < lVar16; lVar34 = lVar34 + lVar29) {
            lVar32 = lVar33;
            lVar39 = lVar40;
            for (uVar30 = 0; uVar30 != (~((long)uVar41 >> 0x3f) & uVar41); uVar30 = uVar30 + 1) {
              lVar31 = lVar32;
              lVar38 = lVar39;
              for (uVar36 = 0; (~((long)uVar18 >> 0x3f) & uVar18) != uVar36; uVar36 = uVar36 + 1) {
                if (((((long)uVar36 < lVar8) && ((long)uVar30 < lVar9)) && (lVar34 < lVar22)) &&
                   ((long)uVar42 < lVar7)) {
                  puVar24 = (undefined1 *)((long)pgVar2->data + lVar31);
                }
                else {
                  puVar24 = (undefined1 *)
                            ((long)pgVar3->data +
                            (uVar30 - local_98[1]) * sVar6 + (lVar34 - local_98[2]) * sVar12 +
                            (uVar42 - local_98[3]) * sVar13 + (uVar36 - local_98[0]) * sVar11);
                }
                lVar31 = lVar31 + sVar15;
                *(undefined1 *)((long)dst->data + lVar38) = *puVar24;
                lVar38 = lVar38 + sVar20;
              }
              lVar32 = lVar32 + sVar5;
              lVar39 = lVar39 + sVar19;
            }
            lVar33 = lVar33 + sVar10 * lVar29;
            lVar40 = lVar40 + sVar21 * lVar29;
          }
          lVar27 = lVar27 + sVar4;
          lVar37 = lVar37 + sVar14;
        }
        return;
      }
      pcVar23 = "dim >= 0 && dim < 4";
      uVar28 = 0x99e;
    }
    else {
      pcVar23 = "ggml_type_size(src0->type) == sizeof(int8_t)";
      uVar28 = 0x995;
    }
    break;
  case GGML_TYPE_I32:
switchD_001361ca_caseD_1a:
    pgVar3 = dst->src[1];
    lVar22 = ggml_type_size();
    if (lVar22 == 4) {
      uVar42 = (ulong)(uint)dst->op_params[0];
      if (uVar42 < 4) {
        lVar35 = (long)params->ith;
        sVar4 = pgVar2->nb[3];
        sVar5 = pgVar2->nb[1];
        lVar22 = pgVar2->ne[2];
        sVar6 = pgVar3->nb[1];
        lVar7 = pgVar2->ne[3];
        lVar8 = pgVar2->ne[0];
        lVar9 = pgVar2->ne[1];
        sVar10 = pgVar2->nb[2];
        sVar11 = pgVar3->nb[0];
        sVar12 = pgVar3->nb[2];
        sVar13 = pgVar3->nb[3];
        sVar14 = dst->nb[3];
        sVar15 = pgVar2->nb[0];
        lVar29 = (long)params->nth;
        lVar16 = dst->ne[2];
        uVar17 = dst->ne[3];
        uVar18 = dst->ne[0];
        sVar19 = dst->nb[1];
        sVar20 = dst->nb[0];
        sVar21 = dst->nb[2];
        uVar41 = dst->ne[1];
        local_98[0] = 0;
        local_98[1] = 0;
        local_98[2] = 0;
        local_98[3] = 0;
        local_98[uVar42] = pgVar2->ne[uVar42];
        lVar37 = sVar21 * lVar35;
        lVar27 = sVar10 * lVar35;
        for (uVar42 = 0; uVar42 != (~((long)uVar17 >> 0x3f) & uVar17); uVar42 = uVar42 + 1) {
          lVar33 = lVar27;
          lVar40 = lVar37;
          for (lVar34 = lVar35; lVar34 < lVar16; lVar34 = lVar34 + lVar29) {
            lVar32 = lVar33;
            lVar39 = lVar40;
            for (uVar30 = 0; uVar30 != (~((long)uVar41 >> 0x3f) & uVar41); uVar30 = uVar30 + 1) {
              lVar31 = lVar32;
              lVar38 = lVar39;
              for (uVar36 = 0; (~((long)uVar18 >> 0x3f) & uVar18) != uVar36; uVar36 = uVar36 + 1) {
                if ((((long)uVar36 < lVar8) && ((long)uVar30 < lVar9)) &&
                   ((lVar34 < lVar22 && ((long)uVar42 < lVar7)))) {
                  puVar26 = (undefined4 *)((long)pgVar2->data + lVar31);
                }
                else {
                  puVar26 = (undefined4 *)
                            ((long)pgVar3->data +
                            (uVar30 - local_98[1]) * sVar6 + (lVar34 - local_98[2]) * sVar12 +
                            (uVar42 - local_98[3]) * sVar13 + (uVar36 - local_98[0]) * sVar11);
                }
                lVar31 = lVar31 + sVar15;
                *(undefined4 *)((long)dst->data + lVar38) = *puVar26;
                lVar38 = lVar38 + sVar20;
              }
              lVar32 = lVar32 + sVar5;
              lVar39 = lVar39 + sVar19;
            }
            lVar33 = lVar33 + sVar10 * lVar29;
            lVar40 = lVar40 + sVar21 * lVar29;
          }
          lVar27 = lVar27 + sVar4;
          lVar37 = lVar37 + sVar14;
        }
        return;
      }
      pcVar23 = "dim >= 0 && dim < 4";
      uVar28 = 0x9f4;
    }
    else {
      pcVar23 = "ggml_type_size(src0->type) == sizeof(float)";
      uVar28 = 0x9eb;
    }
    break;
  case GGML_TYPE_I64:
  case GGML_TYPE_F64:
  case GGML_TYPE_IQ1_M:
switchD_001361ca_caseD_1b:
    pgVar3 = dst->src[1];
    __n = ggml_type_size();
    uVar42 = (ulong)(uint)dst->op_params[0];
    if (uVar42 < 4) {
      lVar37 = (long)params->nth;
      local_50 = (long)params->ith;
      sVar4 = dst->nb[2];
      local_38 = dst->ne[3];
      lVar22 = pgVar2->ne[1];
      lVar7 = pgVar2->ne[2];
      lVar8 = pgVar2->ne[0];
      sVar5 = pgVar2->nb[2];
      lVar9 = pgVar2->ne[3];
      sVar6 = pgVar2->nb[0];
      local_70 = sVar4 * local_50;
      sVar10 = pgVar2->nb[1];
      local_40 = pgVar2->nb[3];
      sVar11 = pgVar3->nb[0];
      sVar12 = pgVar3->nb[1];
      sVar13 = pgVar3->nb[2];
      local_48 = pgVar3->nb[3];
      lVar16 = dst->ne[2];
      sVar14 = dst->nb[0];
      sVar15 = dst->nb[1];
      local_58 = dst->nb[3];
      uVar17 = dst->ne[0];
      uVar18 = dst->ne[1];
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      local_98[uVar42] = pgVar2->ne[uVar42];
      lVar35 = local_98[2];
      lVar29 = local_98[1];
      lVar27 = local_98[0];
      local_68 = sVar5 * local_50;
      local_38 = ~((long)local_38 >> 0x3f) & local_38;
      local_60 = local_98[3];
      for (uVar42 = 0; uVar42 != local_38; uVar42 = uVar42 + 1) {
        lVar34 = (uVar42 - local_60) * local_48;
        local_178 = local_70;
        local_180 = local_68;
        for (lVar33 = local_50; lVar33 < lVar16; lVar33 = lVar33 + lVar37) {
          lVar40 = local_178;
          lVar32 = local_180;
          for (uVar41 = 0; uVar41 != (~((long)uVar18 >> 0x3f) & uVar18); uVar41 = uVar41 + 1) {
            lVar39 = lVar40;
            lVar31 = lVar32;
            for (uVar30 = 0; (~((long)uVar17 >> 0x3f) & uVar17) != uVar30; uVar30 = uVar30 + 1) {
              if (((((long)uVar30 < lVar8) && ((long)uVar41 < lVar22)) && (lVar33 < lVar7)) &&
                 ((long)uVar42 < lVar9)) {
                __src = (void *)((long)pgVar2->data + lVar31);
              }
              else {
                __src = (void *)((long)pgVar3->data +
                                (uVar41 - lVar29) * sVar12 + (lVar33 - lVar35) * sVar13 + lVar34 +
                                (uVar30 - lVar27) * sVar11);
              }
              memcpy((void *)((long)dst->data + lVar39),__src,__n);
              lVar31 = lVar31 + sVar6;
              lVar39 = lVar39 + sVar14;
            }
            lVar32 = lVar32 + sVar10;
            lVar40 = lVar40 + sVar15;
          }
          local_180 = local_180 + sVar5 * lVar37;
          local_178 = local_178 + sVar4 * lVar37;
        }
        local_68 = local_68 + local_40;
        local_70 = local_70 + local_58;
      }
      return;
    }
    pcVar23 = "dim >= 0 && dim < 4";
    uVar28 = 0x973;
    break;
  default:
    if (gVar1 == GGML_TYPE_F32) goto switchD_001361ca_caseD_1a;
    if (gVar1 != GGML_TYPE_F16) goto switchD_001361ca_caseD_1b;
  case GGML_TYPE_I16:
  case GGML_TYPE_BF16:
    pgVar3 = dst->src[1];
    lVar22 = ggml_type_size();
    if (lVar22 == 2) {
      uVar42 = (ulong)(uint)dst->op_params[0];
      if (uVar42 < 4) {
        lVar35 = (long)params->ith;
        sVar4 = pgVar2->nb[3];
        sVar5 = pgVar2->nb[1];
        lVar22 = pgVar2->ne[2];
        sVar6 = pgVar3->nb[1];
        lVar7 = pgVar2->ne[3];
        lVar8 = pgVar2->ne[0];
        lVar9 = pgVar2->ne[1];
        sVar10 = pgVar2->nb[2];
        sVar11 = pgVar3->nb[0];
        sVar12 = pgVar3->nb[2];
        sVar13 = pgVar3->nb[3];
        sVar14 = dst->nb[3];
        sVar15 = pgVar2->nb[0];
        lVar29 = (long)params->nth;
        lVar16 = dst->ne[2];
        uVar17 = dst->ne[3];
        uVar18 = dst->ne[0];
        sVar19 = dst->nb[1];
        sVar20 = dst->nb[0];
        sVar21 = dst->nb[2];
        uVar41 = dst->ne[1];
        local_98[0] = 0;
        local_98[1] = 0;
        local_98[2] = 0;
        local_98[3] = 0;
        local_98[uVar42] = pgVar2->ne[uVar42];
        lVar37 = sVar21 * lVar35;
        lVar27 = sVar10 * lVar35;
        for (uVar42 = 0; uVar42 != (~((long)uVar17 >> 0x3f) & uVar17); uVar42 = uVar42 + 1) {
          lVar33 = lVar27;
          lVar40 = lVar37;
          for (lVar34 = lVar35; lVar34 < lVar16; lVar34 = lVar34 + lVar29) {
            lVar32 = lVar33;
            lVar39 = lVar40;
            for (uVar30 = 0; uVar30 != (~((long)uVar41 >> 0x3f) & uVar41); uVar30 = uVar30 + 1) {
              lVar31 = lVar32;
              lVar38 = lVar39;
              for (uVar36 = 0; (~((long)uVar18 >> 0x3f) & uVar18) != uVar36; uVar36 = uVar36 + 1) {
                if ((((long)uVar36 < lVar8) && ((long)uVar30 < lVar9)) &&
                   ((lVar34 < lVar22 && ((long)uVar42 < lVar7)))) {
                  puVar25 = (undefined2 *)((long)pgVar2->data + lVar31);
                }
                else {
                  puVar25 = (undefined2 *)
                            ((long)pgVar3->data +
                            (uVar30 - local_98[1]) * sVar6 + (lVar34 - local_98[2]) * sVar12 +
                            (uVar42 - local_98[3]) * sVar13 + (uVar36 - local_98[0]) * sVar11);
                }
                lVar31 = lVar31 + sVar15;
                *(undefined2 *)((long)dst->data + lVar38) = *puVar25;
                lVar38 = lVar38 + sVar20;
              }
              lVar32 = lVar32 + sVar5;
              lVar39 = lVar39 + sVar19;
            }
            lVar33 = lVar33 + sVar10 * lVar29;
            lVar40 = lVar40 + sVar21 * lVar29;
          }
          lVar27 = lVar27 + sVar4;
          lVar37 = lVar37 + sVar14;
        }
        return;
      }
      pcVar23 = "dim >= 0 && dim < 4";
      uVar28 = 0x9c9;
    }
    else {
      pcVar23 = "ggml_type_size(src0->type) == sizeof(ggml_fp16_t)";
      uVar28 = 0x9c0;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar28,"GGML_ASSERT(%s) failed",pcVar23);
}

Assistant:

void ggml_compute_forward_concat(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F16:
        case GGML_TYPE_BF16:
        case GGML_TYPE_I16:
            {
                ggml_compute_forward_concat_f16(params, dst);
            } break;
        case GGML_TYPE_I8:
            {
                ggml_compute_forward_concat_i8(params, dst);
            } break;
        case GGML_TYPE_F32:
        case GGML_TYPE_I32:
            {
                ggml_compute_forward_concat_f32(params, dst);
            } break;
        default:
            {
                ggml_compute_forward_concat_any(params, dst);
            }
    }
}